

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry.cpp
# Opt level: O2

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"hair_geometry",&local_31);
  SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
            (&this->super_SceneLoadingTutorialApplication,&local_30,1);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SceneLoadingTutorialApplication).super_TutorialApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__SceneLoadingTutorialApplication_002a6d10;
  return;
}

Assistant:

Tutorial()
      : SceneLoadingTutorialApplication(NAME,FEATURES) {}